

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MOVSX(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift
            )

{
  uchar *puVar1;
  x86Reg index_00;
  uint uVar2;
  
  if (0xfffffffd < size + ~sQWORD) {
    __assert_fail("size != sDWORD && size != sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x3cc,"int x86MOVSX(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)")
    ;
  }
  index_00 = index;
  if ((multiplier == 1 && base == rNONE) && index != rNONE) {
    index_00 = rNONE;
    base = index;
  }
  uVar2 = encodeRex(stream,false,dst,index_00,base);
  puVar1 = stream + uVar2;
  *puVar1 = '\x0f';
  puVar1[1] = size == sBYTE ^ 0xbf;
  uVar2 = encodeAddress(puVar1 + 2,index_00,multiplier,base,shift,(int)regCode[dst]);
  return (uVar2 + (int)(puVar1 + 2)) - (int)stream;
}

Assistant:

int x86MOVSX(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size != sDWORD && size != sQWORD);

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	stream += encodeRex(stream, false, dst, index, base);

	*stream++ = 0x0f;
	*stream++ = size == sBYTE ? 0xbe : 0xbf;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}